

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O2

void AI::writeCell(Cell *cell,Vector2<int> gridCoordinates,float currentIntensity,
                  SoundSource *source)

{
  int iVar1;
  int iVar2;
  
  iVar1 = cell->numberOfWaves;
  iVar2 = 10;
  if (iVar1 < 10) {
    iVar2 = iVar1;
  }
  cell->intersectingWaves[iVar2].gridCoordinates = gridCoordinates;
  cell->intersectingWaves[iVar2].intensity = currentIntensity;
  cell->intersectingWaves[iVar2].id = source->id;
  cell->intersectingWaves[iVar2].tag = source->tag;
  cell->intersectingWaves[iVar2].originalPosition = source->originalPosition;
  cell->numberOfWaves = iVar1 + 1;
  return;
}

Assistant:

inline void writeCell(Cell& cell, Vector2<int> gridCoordinates, float currentIntensity, const SoundSource& source)
	{
		int waveId = cell.numberOfWaves < Cell::MaxIntersectingWaves ? cell.numberOfWaves : Cell::MaxIntersectingWaves; 
		cell.intersectingWaves[waveId].gridCoordinates = gridCoordinates;
		cell.intersectingWaves[waveId].intensity = currentIntensity;
		cell.intersectingWaves[waveId].id = source.id;
		cell.intersectingWaves[waveId].tag = source.tag;
		cell.intersectingWaves[waveId].originalPosition = source.originalPosition;
		cell.numberOfWaves++;
	}